

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool slang::ast::Bitstream::canBeSource
               (Type *target,StreamingConcatenationExpression *rhs,SourceLocation assignLoc,
               ASTContext *context)

{
  bool bVar1;
  size_t in_RAX;
  size_t sVar2;
  size_t sVar3;
  Diagnostic *pDVar4;
  size_t local_38;
  
  local_38 = in_RAX;
  bVar1 = Type::isBitstreamType(target,true);
  if (bVar1) {
    if (((context->flags).m_bits & 2) != 0) {
      return true;
    }
    bVar1 = Type::isFixedSize(target);
    if (!bVar1) {
      return true;
    }
    sVar2 = Type::bitstreamWidth(target);
    sVar3 = StreamingConcatenationExpression::bitstreamWidth(rhs);
    if (sVar3 <= sVar2) {
      return sVar3 <= sVar2;
    }
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x2b0007,assignLoc);
    local_38 = sVar2;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
    ::emplace_back<unsigned_long>(&pDVar4->args,&local_38);
    local_38 = sVar3;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
    ::emplace_back<unsigned_long>(&pDVar4->args,&local_38);
  }
  else {
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x2e0007,assignLoc);
    pDVar4 = ast::operator<<(pDVar4,target);
  }
  Diagnostic::operator<<(pDVar4,(rhs->super_Expression).sourceRange);
  return false;
}

Assistant:

bool Bitstream::canBeSource(const Type& target, const StreamingConcatenationExpression& rhs,
                            SourceLocation assignLoc, const ASTContext& context) {
    if (!target.isBitstreamType(true)) {
        context.addDiag(diag::BadStreamTargetType, assignLoc) << target << rhs.sourceRange;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch
    if (!target.isFixedSize())
        return true; // Sizes checked at constant evaluation or runtime

    auto targetWidth = target.bitstreamWidth();
    auto sourceWidth = rhs.bitstreamWidth();
    if (targetWidth < sourceWidth) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignLoc) << targetWidth << sourceWidth;
        diag << rhs.sourceRange;
        return false;
    }

    return true;
}